

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adsc.c
# Opt level: O2

void la_adsc_contract_request_format_json(la_adsc_formatter_ctx_t *ctx,char *label,void *data)

{
  void *pvVar1;
  long lVar2;
  size_t sVar3;
  la_list *l;
  
  la_json_append_int64(ctx->vstr,"contract_num",(ulong)*data);
  sVar3 = la_list_length(*(la_list **)((long)data + 8));
  if (sVar3 == 0) {
    return;
  }
  la_json_array_start(ctx->vstr,"groups");
  for (l = *(la_list **)((long)data + 8); l != (la_list *)0x0; l = la_list_next(l)) {
    pvVar1 = l->data;
    lVar2 = *(long *)((long)pvVar1 + 8);
    if (((lVar2 == 0) || (*(long *)(lVar2 + 0x20) == 0)) || (*(long *)(lVar2 + 8) == 0)) break;
    la_json_object_start(ctx->vstr,(char *)0x0);
    la_json_object_start(ctx->vstr,*(char **)(*(long *)((long)pvVar1 + 8) + 8));
    (**(code **)(*(long *)((long)pvVar1 + 8) + 0x20))(ctx,0,*(undefined8 *)((long)pvVar1 + 0x10));
    la_json_object_end(ctx->vstr);
    la_json_object_end(ctx->vstr);
  }
  la_json_array_end(ctx->vstr);
  return;
}

Assistant:

LA_ADSC_FORMATTER_FUN(la_adsc_contract_request_format_json) {
	LA_UNUSED(label);
	la_adsc_req_t const *r = data;
	la_json_append_int64(ctx->vstr, "contract_num", r->contract_num);

	size_t len = la_list_length(r->req_tag_list);
	if(len == 0) {
		return;
	}
	la_json_array_start(ctx->vstr, "groups");
	for(la_list *ptr = r->req_tag_list; ptr != NULL; ptr = la_list_next(ptr)) {
		la_adsc_tag_t *t = ptr->data;
		if(t->type == NULL || t->type->format_json == NULL || t->type->json_key == NULL) {
			break;
		}
		la_json_object_start(ctx->vstr, NULL);
		la_json_object_start(ctx->vstr, t->type->json_key);
		t->type->format_json(ctx, NULL, t->data);
		la_json_object_end(ctx->vstr);
		la_json_object_end(ctx->vstr);
	}
	la_json_array_end(ctx->vstr);
}